

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *toTag;
  XmlOutput *name;
  XmlOutput *ch;
  XmlOutput *o;
  XmlOutput *this_00;
  undefined4 in_register_00000034;
  char *pcVar1;
  long in_FS_OFFSET;
  xml_output *in_stack_fffffffffffffb60;
  xml_output *this_01;
  QString *in_stack_fffffffffffffb68;
  triState v;
  char *name_00;
  QString *in_stack_fffffffffffffb78;
  char *in_stack_fffffffffffffb98;
  xml_output *in_stack_fffffffffffffba8;
  XmlOutput *in_stack_fffffffffffffbb0;
  QString local_3f0;
  xml_output local_3d8 [17];
  long local_8;
  
  pcVar1 = (char *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  name_00 = pcVar1;
  QString::QString(in_stack_fffffffffffffb68,in_stack_fffffffffffffb98);
  tag(in_stack_fffffffffffffb78);
  toTag = XmlOutput::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  attrS((char *)in_stack_fffffffffffffb68,(QString *)in_stack_fffffffffffffb60);
  name = XmlOutput::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  attrS((char *)in_stack_fffffffffffffb68,(QString *)in_stack_fffffffffffffb60);
  XmlOutput::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  attrT(name_00,(triState)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  XmlOutput::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  attrT(name_00,(triState)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  ch = XmlOutput::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  attrE(name_00,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(int)in_stack_fffffffffffffb68);
  XmlOutput::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  attrE((char *)name,(int)((ulong)toTag >> 0x20));
  o = XmlOutput::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  attrS((char *)in_stack_fffffffffffffb68,(QString *)in_stack_fffffffffffffb60);
  this_00 = XmlOutput::operator<<(in_stack_fffffffffffffbb0,(xml_output *)o);
  attrS((char *)in_stack_fffffffffffffb68,(QString *)in_stack_fffffffffffffb60);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrS((char *)in_stack_fffffffffffffb68,(QString *)in_stack_fffffffffffffb60);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrS((char *)in_stack_fffffffffffffb68,(QString *)in_stack_fffffffffffffb60);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrS((char *)in_stack_fffffffffffffb68,(QString *)in_stack_fffffffffffffb60);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrT(name_00,(triState)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrE(name_00,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(int)in_stack_fffffffffffffb68);
  v = (triState)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrE((char *)name,(int)((ulong)toTag >> 0x20));
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrT(name_00,v);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffb60);
  QString::~QString((QString *)0x27d035);
  (*this->_vptr_VCProjectWriter[4])(this,pcVar1,(long)__buf + 0x118);
  if (*(int *)((long)__buf + 0x14) == 4) {
    (*this->_vptr_VCProjectWriter[9])(this,pcVar1,(long)__buf + 0x868);
  }
  else {
    (*this->_vptr_VCProjectWriter[5])(this,pcVar1,(long)__buf + 0x438);
  }
  (*this->_vptr_VCProjectWriter[6])(this,pcVar1,(long)__buf + 0x940);
  (*this->_vptr_VCProjectWriter[7])(this,pcVar1,(long)__buf + 0x950);
  (*this->_vptr_VCProjectWriter[0xb])(this,pcVar1,(long)__buf + 0xb78);
  (*this->_vptr_VCProjectWriter[0xb])(this,pcVar1,(long)__buf + 0xc00);
  (*this->_vptr_VCProjectWriter[0xb])(this,pcVar1,(long)__buf + 0xcd8);
  (*this->_vptr_VCProjectWriter[10])(this,pcVar1,(long)__buf + 0xd60);
  (*this->_vptr_VCProjectWriter[0xc])(this,pcVar1,(long)__buf + 0xc88);
  QString::QString(&local_3f0,(char *)ch);
  this_01 = local_3d8;
  closetag((QString *)toTag);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x27d22a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCConfiguration &tool)
{
    xml << tag(_Configuration)
            << attrS(_Name, tool.Name)
            << attrS(_OutputDirectory, tool.OutputDirectory)
            << attrT(_ATLMinimizesCRunTimeLibraryUsage, tool.ATLMinimizesCRunTimeLibraryUsage)
            << attrT(_BuildBrowserInformation, tool.BuildBrowserInformation)
            << attrE(_CharacterSet, tool.CharacterSet, /*ifNot*/ charSetNotSet)
            << attrE(_ConfigurationType, tool.ConfigurationType)
            << attrS(_DeleteExtensionsOnClean, tool.DeleteExtensionsOnClean)
            << attrS(_ImportLibrary, tool.ImportLibrary)
            << attrS(_IntermediateDirectory, tool.IntermediateDirectory)
            << attrS(_PrimaryOutput, tool.PrimaryOutput)
            << attrS(_ProgramDatabase, tool.ProgramDatabase)
            << attrT(_RegisterOutput, tool.RegisterOutput)
            << attrE(_UseOfATL, tool.UseOfATL, /*ifNot*/ useATLNotSet)
            << attrE(_UseOfMfc, tool.UseOfMfc)
            << attrT(_WholeProgramOptimization, tool.WholeProgramOptimization);
    write(xml, tool.compiler);
    if (tool.ConfigurationType == typeStaticLibrary)
        write(xml, tool.librarian);
    else
        write(xml, tool.linker);
    write(xml, tool.manifestTool);
    write(xml, tool.idl);
    write(xml, tool.postBuild);
    write(xml, tool.preBuild);
    write(xml, tool.preLink);
    write(xml, tool.resource);
    write(xml, tool.deployment);
    xml << closetag(_Configuration);
}